

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O2

bool tinyusdz::hasQuotes(string *str,bool is_double_quote)

{
  char cVar1;
  size_t i;
  ulong uVar2;
  
  for (uVar2 = 0; str->_M_string_length != uVar2; uVar2 = uVar2 + 1) {
    cVar1 = (str->_M_dataplus)._M_p[uVar2];
    if (is_double_quote) {
      if (cVar1 == '\"') break;
    }
    else if (cVar1 == '\'') break;
  }
  return uVar2 < str->_M_string_length;
}

Assistant:

bool hasQuotes(const std::string &str, bool is_double_quote) {
  for (size_t i = 0; i < str.size(); i++) {
    if (is_double_quote) {
      if (str[i] == '"') {
        return true;
      }
    } else {
      if (str[i] == '\'') {
        return true;
      }
    }
  }

  return false;
}